

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DockNodeIsDropAllowed(ImGuiWindow *host_window,ImGuiWindow *root_payload)

{
  ImGuiDockNode *pIVar1;
  bool bVar2;
  uint uVar3;
  ImGuiWindow *payload;
  ulong uVar4;
  
  pIVar1 = root_payload->DockNodeAsHost;
  uVar3 = 1;
  if (pIVar1 != (ImGuiDockNode *)0x0) {
    if (pIVar1->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      return true;
    }
    if (pIVar1 != (ImGuiDockNode *)0x0) {
      uVar3 = (pIVar1->Windows).Size;
    }
  }
  bVar2 = 0 < (int)uVar3;
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      payload = root_payload;
      if (pIVar1 != (ImGuiDockNode *)0x0) {
        payload = (pIVar1->Windows).Data[uVar4];
      }
      bVar2 = DockNodeIsDropAllowedOne(payload,host_window);
      if (bVar2) {
        return true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    bVar2 = uVar4 < uVar3;
  }
  return bVar2;
}

Assistant:

static bool ImGui::DockNodeIsDropAllowed(ImGuiWindow* host_window, ImGuiWindow* root_payload)
{
    if (root_payload->DockNodeAsHost && root_payload->DockNodeAsHost->IsSplitNode())
        return true;

    const int payload_count = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows.Size : 1;
    for (int payload_n = 0; payload_n < payload_count; payload_n++)
    {
        ImGuiWindow* payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows[payload_n] : root_payload;
        if (DockNodeIsDropAllowedOne(payload, host_window))
            return true;
    }
    return false;
}